

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCodeModel
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *cm;
  Value *this_00;
  Value local_a8;
  undefined1 local_80 [8];
  Value result;
  allocator local_41;
  string local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServerProtocol1 *)__return_storage_ptr__;
  if (this->m_State == STATE_COMPUTED) {
    Json::Value::Value((Value *)local_80,objectValue);
    cm = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
    DumpConfigurationsList(&local_a8,cm);
    this_00 = Json::Value::operator[]((Value *)local_80,&kCONFIGURATIONS_KEY_abi_cxx11_);
    Json::Value::operator=(this_00,&local_a8);
    Json::Value::~Value(&local_a8);
    cmServerRequest::Reply(__return_storage_ptr__,local_20,(Value *)local_80);
    Json::Value::~Value((Value *)local_80);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"No build system was generated yet.",&local_41)
    ;
    cmServerRequest::ReportError(__return_storage_ptr__,request,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCodeModel(
  const cmServerRequest& request)
{
  if (this->m_State != STATE_COMPUTED) {
    return request.ReportError("No build system was generated yet.");
  }

  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpConfigurationsList(this->CMakeInstance());
  return request.Reply(result);
}